

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O2

int nghttp2_map_each(nghttp2_map *map,_func_int_void_ptr_void_ptr *func,void *ptr)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 8;
  uVar3 = 0;
  while ((iVar2 = 0, uVar3 < map->tablelen &&
         ((pvVar1 = *(void **)((long)&map->table->hash + lVar4), pvVar1 == (void *)0x0 ||
          (iVar2 = (*func)(pvVar1,ptr), iVar2 == 0))))) {
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x10;
  }
  return iVar2;
}

Assistant:

int nghttp2_map_each(nghttp2_map *map, int (*func)(void *data, void *ptr),
                     void *ptr) {
  int rv;
  uint32_t i;
  nghttp2_map_bucket *bkt;

  for (i = 0; i < map->tablelen; ++i) {
    bkt = &map->table[i];

    if (bkt->data == NULL) {
      continue;
    }

    rv = func(bkt->data, ptr);
    if (rv != 0) {
      return rv;
    }
  }

  return 0;
}